

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int moveToLeftmost(BtCursor *pCur)

{
  MemPage *pMVar1;
  u32 newPgno;
  int iVar2;
  
  iVar2 = 0;
  while ((iVar2 == 0 && (pMVar1 = pCur->pPage, pMVar1->leaf == '\0'))) {
    newPgno = sqlite3Get4byte(pMVar1->aData +
                              (CONCAT11(pMVar1->aCellIdx[(ulong)pCur->ix * 2],
                                        pMVar1->aCellIdx[(ulong)pCur->ix * 2 + 1]) &
                              pMVar1->maskPage));
    iVar2 = moveToChild(pCur,newPgno);
  }
  return iVar2;
}

Assistant:

static int moveToLeftmost(BtCursor *pCur){
  Pgno pgno;
  int rc = SQLITE_OK;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  while( rc==SQLITE_OK && !(pPage = pCur->pPage)->leaf ){
    assert( pCur->ix<pPage->nCell );
    pgno = get4byte(findCell(pPage, pCur->ix));
    rc = moveToChild(pCur, pgno);
  }
  return rc;
}